

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O1

void LoadObjects(Level *NewLev)

{
  byte *pbVar1;
  ObjectType *pOVar2;
  int iVar3;
  Object *pOVar4;
  bool bVar5;
  
  ExpectToken(TK_OPENBRACE);
  while (GetToken(), Token.Type == TK_OPENBRACE) {
    pOVar4 = NewObject();
    NewLev->TotalObjects = NewLev->TotalObjects + 1;
    ExpectToken(TK_NUMBER);
    pOVar4->Pos[0] = Token.FQuantity;
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    pOVar4->Pos[1] = Token.FQuantity;
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    pOVar4->Angle = Token.FQuantity;
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    iVar3 = Token.IQuantity;
    if (Token.IQuantity < 0) {
      pOVar4->ObjType = &NewLev->Door;
      *(byte *)&pOVar4->Flags = (byte)pOVar4->Flags | 2;
      NewLev->TotalObjects = NewLev->TotalObjects + -1;
    }
    else {
      pOVar2 = NewLev->AllObjectTypes;
      pOVar4->ObjType = pOVar2;
      while (pOVar2 != (ObjectType *)0x0) {
        bVar5 = iVar3 == 0;
        iVar3 = iVar3 + -1;
        if (bVar5) {
          Token.IQuantity = -1;
          break;
        }
        pOVar2 = pOVar2->Next;
        pOVar4->ObjType = pOVar2;
        Token.IQuantity = iVar3;
      }
      if (Token.IQuantity != -1) {
        Error = 1;
        snprintf(ErrorText,0x400,"Unknown object referenced at line %d",(ulong)(uint)Lines);
        return;
      }
    }
    GetToken();
    if (Token.Type != TK_CLOSEBRACE) {
      if (Token.Type != TK_COMMA) goto LAB_0010dc29;
      bVar5 = false;
      do {
        GetToken();
        if (Token.Type == TK_CLOSEBRACE) {
          bVar5 = true;
        }
        else {
          if (Token.Type != TK_STRING) goto LAB_0010dc29;
          if (CONCAT35(Token.Text._8_3_,Token.Text._3_5_) == 0x656c626164696c &&
              CONCAT53(Token.Text._3_5_,Token.Text._0_3_) == 0x626164696c6c6f63) {
            pbVar1 = (byte *)((long)&pOVar4->Flags + 1);
            *pbVar1 = *pbVar1 | 1;
          }
          if (CONCAT35(Token.Text._8_3_,Token.Text._3_5_) == 0x646e756f726765 &&
              CONCAT53(Token.Text._3_5_,Token.Text._0_3_) == 0x756f726765726f66) {
            pbVar1 = (byte *)((long)&pOVar4->Flags + 1);
            *pbVar1 = *pbVar1 | 2;
          }
        }
      } while (!bVar5);
    }
    pOVar4->Next = NewLev->AllObjects;
    NewLev->AllObjects = pOVar4;
  }
  if (Token.Type != TK_CLOSEBRACE) {
LAB_0010dc29:
    Error = 1;
  }
  return;
}

Assistant:

void LoadObjects(struct Level *NewLev)
{
   struct Object *Obj;
   int Finished;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               Obj = NewObject();
               NewLev->TotalObjects++;

               /* read location */
               ExpectToken(TK_NUMBER);
               Obj->Pos[0] = Token.FQuantity;
               ExpectToken(TK_COMMA);
               ExpectToken(TK_NUMBER);
               Obj->Pos[1] = Token.FQuantity;
               ExpectToken(TK_COMMA);

               /* read angle, convert into Allegro format */
               ExpectToken(TK_NUMBER);
               Obj->Angle = Token.FQuantity;
               ExpectToken(TK_COMMA);

               /* read object type, manipulate pointer */
               ExpectToken(TK_NUMBER);
               if (Token.IQuantity >= 0) {
                  Obj->ObjType = NewLev->AllObjectTypes;
                  while (Obj->ObjType && Token.IQuantity--)
                     Obj->ObjType = Obj->ObjType->Next;

                  if (Token.IQuantity != -1) {
                     Error = 1;
                     snprintf(ErrorText, sizeof(ErrorText),
                               "Unknown object referenced at line %d", Lines);
                     return;
                  }
               } else {
                  /* this is the door - a hard coded type */
                  Obj->ObjType = &NewLev->Door;
                  Obj->Flags |= OBJFLAGS_DOOR;
                  NewLev->TotalObjects--;
               }

               /* parse any flags that may exist */
               GetToken();
               switch (Token.Type) {
                  case TK_COMMA:
                     {
                        Finished = false;
                        while (!Finished) {
                           GetToken();
                           switch (Token.Type) {
                              case TK_CLOSEBRACE:
                                 Finished = true;
                                 break;
                              case TK_STRING:
                                 if (!strcmp(Token.Text, "collidable"))
                                    Obj->Flags |= FLAGS_COLLIDABLE;
                                 if (!strcmp(Token.Text, "foreground"))
                                    Obj->Flags |= FLAGS_FOREGROUND;
                                 break;
                              default:
                                 Error = 1;
                                 return;
                           }
                        }
                     }
                     break;
                  case TK_CLOSEBRACE:
                     break;
                  default:
                     Error = 1;
                     return;
               }

               /* thread into list */
               Obj->Next = NewLev->AllObjects;
               NewLev->AllObjects = Obj;
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}